

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_00584a50;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

char const* Exception::what() const JSONCPP_NOEXCEPT
{
  return msg_.c_str();
}